

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void Internal_WeldAndAddNgon
               (ON_Mesh *mesh,ON_MeshTopology *top,uchar xmark,uchar *fmarks,
               ON_SimpleArray<unsigned_int> *ngon_fi)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int mesh_vertex_count;
  uint uVar4;
  uint *puVar5;
  ON_MeshFace *pOVar6;
  undefined1 local_80 [8];
  ON_MeshFace q;
  int f1vi [2];
  int f1ei;
  int f0vi [2];
  int f0ei;
  ON_MeshFace f [2];
  ON_SimpleArray<unsigned_int> *ngon_fi_local;
  uchar *fmarks_local;
  uchar xmark_local;
  ON_MeshTopology *top_local;
  ON_Mesh *mesh_local;
  
  iVar3 = ON_SimpleArray<unsigned_int>::Count(ngon_fi);
  if (1 < iVar3) {
    Internal_WeldNgonCandiate(mesh,top,fmarks,xmark,ngon_fi);
    iVar3 = ON_SimpleArray<unsigned_int>::Count(ngon_fi);
    if (iVar3 == 2) {
      puVar5 = ON_SimpleArray<unsigned_int>::operator[](ngon_fi,0);
      uVar4 = *puVar5;
      puVar5 = ON_SimpleArray<unsigned_int>::operator[](ngon_fi,1);
      if (uVar4 != *puVar5) {
        puVar5 = ON_SimpleArray<unsigned_int>::operator[](ngon_fi,0);
        pOVar6 = ON_SimpleArray<ON_MeshFace>::operator[](&mesh->m_F,*puVar5);
        bVar2 = ON_MeshFace::IsTriangle(pOVar6);
        if (bVar2) {
          puVar5 = ON_SimpleArray<unsigned_int>::operator[](ngon_fi,1);
          pOVar6 = ON_SimpleArray<ON_MeshFace>::operator[](&mesh->m_F,*puVar5);
          bVar2 = ON_MeshFace::IsTriangle(pOVar6);
          if (bVar2) {
            puVar5 = ON_SimpleArray<unsigned_int>::operator[](ngon_fi,0);
            pOVar6 = ON_SimpleArray<ON_MeshFace>::operator[](&mesh->m_F,*puVar5);
            unique0x00012000 = *(undefined8 *)pOVar6->vi;
            f[0].vi._0_8_ = *(undefined8 *)(pOVar6->vi + 2);
            puVar5 = ON_SimpleArray<unsigned_int>::operator[](ngon_fi,1);
            pOVar6 = ON_SimpleArray<ON_MeshFace>::operator[](&mesh->m_F,*puVar5);
            f[0].vi._8_8_ = *(undefined8 *)pOVar6->vi;
            f[1].vi._0_8_ = *(undefined8 *)(pOVar6->vi + 2);
            for (f0vi[0] = 0; f0vi[0] < 3; f0vi[0] = f0vi[0] + 1) {
              iVar3 = f0vi[(long)f0vi[0] + 1];
              iVar1 = f0vi[(long)((f0vi[0] + 1) % 3) + 1];
              for (f1vi[0] = 0; f1vi[0] < 3; f1vi[0] = f1vi[0] + 1) {
                q.vi[2] = f[0].vi[(long)f1vi[0] + 2];
                q.vi[3] = f[0].vi[(long)((f1vi[0] + 1) % 3) + 2];
                if ((iVar3 == q.vi[3]) && (iVar1 == q.vi[2])) {
                  *(int *)(local_80 + (long)f0vi[0] * 4) = f0vi[(long)f0vi[0] + 1];
                  *(int *)(local_80 + (long)((f0vi[0] + 1) % 4) * 4) =
                       f[0].vi[(long)((f1vi[0] + 2) % 3) + 2];
                  *(int *)(local_80 + (long)((f0vi[0] + 2) % 4) * 4) =
                       f0vi[(long)((f0vi[0] + 1) % 3) + 1];
                  *(int *)(local_80 + (long)((f0vi[0] + 3) % 4) * 4) =
                       f0vi[(long)((f0vi[0] + 2) % 3) + 1];
                  bVar2 = ON_MeshFace::IsQuad((ON_MeshFace *)local_80);
                  if (bVar2) {
                    mesh_vertex_count =
                         ON_SimpleArray<ON_3fPoint>::Count
                                   (&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
                    bVar2 = ON_MeshFace::IsValid((ON_MeshFace *)local_80,mesh_vertex_count);
                    if (bVar2) {
                      puVar5 = ON_SimpleArray<unsigned_int>::operator[](ngon_fi,0);
                      pOVar6 = ON_SimpleArray<ON_MeshFace>::operator[](&mesh->m_F,*puVar5);
                      *(ulong *)pOVar6->vi = CONCAT44(local_80._4_4_,local_80._0_4_);
                      *(ulong *)(pOVar6->vi + 2) = CONCAT44(q.vi[1],q.vi[0]);
                      local_80._0_4_ = -1;
                      local_80._4_4_ = -1;
                      q.vi[0] = -1;
                      q.vi[1] = -1;
                      puVar5 = ON_SimpleArray<unsigned_int>::operator[](ngon_fi,1);
                      pOVar6 = ON_SimpleArray<ON_MeshFace>::operator[](&mesh->m_F,*puVar5);
                      *(ulong *)pOVar6->vi = CONCAT44(local_80._4_4_,local_80._0_4_);
                      *(ulong *)(pOVar6->vi + 2) = CONCAT44(q.vi[1],q.vi[0]);
                      ON_SimpleArray<unsigned_int>::SetCount(ngon_fi,1);
                      puVar5 = ON_SimpleArray<unsigned_int>::Array(ngon_fi);
                      ON_Mesh::AddNgon(mesh,1,puVar5);
                      return;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar4 = ON_SimpleArray<unsigned_int>::UnsignedCount(ngon_fi);
    puVar5 = ON_SimpleArray<unsigned_int>::Array(ngon_fi);
    ON_Mesh::AddNgon(mesh,uVar4,puVar5);
  }
  return;
}

Assistant:

static void Internal_WeldAndAddNgon(
  ON_Mesh& mesh,
  const ON_MeshTopology& top,
  const unsigned char xmark,
  unsigned char* fmarks,
   ON_SimpleArray<unsigned>& ngon_fi
)
{
  if (ngon_fi.Count() < 2)
    return;

  // ngons must be welded and MergeFaces supports making an ngon across an unwelded edge.
  Internal_WeldNgonCandiate(mesh,top,fmarks,xmark,ngon_fi);

  if (
    2 == ngon_fi.Count() 
    &&ngon_fi[0] != ngon_fi[1]
    && mesh.m_F[ngon_fi[0]].IsTriangle() 
    && mesh.m_F[ngon_fi[1]].IsTriangle()
    )
  {
    // make a single quad face
    ON_MeshFace f[2] = {mesh.m_F[ngon_fi[0]],mesh.m_F[ngon_fi[1]]};
    for (int f0ei = 0; f0ei < 3; ++f0ei)
    {
      const int f0vi[2] = { f[0].vi[f0ei],f[0].vi[(f0ei + 1) % 3] };
      for (int f1ei = 0; f1ei < 3; ++f1ei)
      {
        const int f1vi[2] = { f[1].vi[f1ei],f[1].vi[(f1ei + 1) % 3] };
        if (f0vi[0] != f1vi[1] || f0vi[1] != f1vi[0])
          continue;
        // merge triangles into a quad
        ON_MeshFace q;
        q.vi[f0ei] = f[0].vi[f0ei];
        q.vi[(f0ei+1)%4] = f[1].vi[(f1ei+2)%3];
        q.vi[(f0ei+2)%4] = f[0].vi[(f0ei+1)%3];
        q.vi[(f0ei+3)%4] = f[0].vi[(f0ei+2)%3];
        if (q.IsQuad() && q.IsValid(mesh.m_V.Count()))
        {
          mesh.m_F[ngon_fi[0]] = q;
          q.vi[0] = -1;
          q.vi[1] = -1;
          q.vi[2] = -1;
          q.vi[3] = -1;
          mesh.m_F[ngon_fi[1]] = q;
          ngon_fi.SetCount(1);
          mesh.AddNgon(1, ngon_fi.Array());
          return;
        }
      }
    }
  }

  mesh.AddNgon(ngon_fi.UnsignedCount(), ngon_fi.Array());
}